

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * ImGui::GetFrontMostPopupModal(void)

{
  ImGuiWindow *pIVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(uint)(GImGui->OpenPopupStack).Size;
  lVar3 = uVar2 * 0x30 + -0x28;
  while( true ) {
    if ((int)uVar2 < 1) {
      return (ImGuiWindow *)0x0;
    }
    pIVar1 = *(ImGuiWindow **)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar3);
    if ((pIVar1 != (ImGuiWindow *)0x0) && ((pIVar1->Flags & 0x8000000) != 0)) break;
    uVar2 = (ulong)((int)uVar2 - 1);
    lVar3 = lVar3 + -0x30;
  }
  return pIVar1;
}

Assistant:

ImGuiWindow* ImGui::GetFrontMostPopupModal()
{
    ImGuiContext& g = *GImGui;
    for (int n = g.OpenPopupStack.Size-1; n >= 0; n--)
        if (ImGuiWindow* popup = g.OpenPopupStack.Data[n].Window)
            if (popup->Flags & ImGuiWindowFlags_Modal)
                return popup;
    return NULL;
}